

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_get_compressed_image_par(fitsfile *infptr,int *status)

{
  float fVar1;
  int iVar2;
  int *in_RSI;
  long in_RDI;
  long maxtilelen;
  long expect_nrows;
  int colNum;
  int oldFormat;
  int doffset;
  int tstatus2;
  int tstatus;
  int ii;
  char value [71];
  char keyword [75];
  long local_e0;
  long local_d8;
  uint uVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar6;
  uint in_stack_ffffffffffffff44;
  uint uVar7;
  char in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff49;
  int in_stack_ffffffffffffff54;
  fitsfile *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  fitsfile *in_stack_ffffffffffffff80;
  char local_68 [80];
  int *local_18;
  long local_10;
  int local_4;
  
  iVar4 = 0;
  uVar3 = 0;
  if (*in_RSI < 1) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                  (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                  (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),(int *)0x0);
    if (iVar2 < 1) {
      *(undefined1 *)(*(long *)(local_10 + 8) + 0x480) = 0;
      strncat((char *)(*(long *)(local_10 + 8) + 0x480),&stack0xffffffffffffff48,0xb);
      if ((((in_stack_ffffffffffffff48 < 'R') || ('R' < in_stack_ffffffffffffff48)) ||
          (iVar2 = strcmp(&stack0xffffffffffffff48,"RICE_1"), iVar2 != 0)) &&
         (((in_stack_ffffffffffffff48 < 'R' || ('R' < in_stack_ffffffffffffff48)) ||
          (iVar2 = strcmp(&stack0xffffffffffffff48,"RICE_ONE"), iVar2 != 0)))) {
        if (((in_stack_ffffffffffffff48 < 'H') || ('H' < in_stack_ffffffffffffff48)) ||
           (iVar2 = strcmp(&stack0xffffffffffffff48,"HCOMPRESS_1"), iVar2 != 0)) {
          if (((in_stack_ffffffffffffff48 < 'G') || ('G' < in_stack_ffffffffffffff48)) ||
             (iVar2 = strcmp(&stack0xffffffffffffff48,"GZIP_1"), iVar2 != 0)) {
            if (((in_stack_ffffffffffffff48 < 'G') || ('G' < in_stack_ffffffffffffff48)) ||
               (iVar2 = strcmp(&stack0xffffffffffffff48,"GZIP_2"), iVar2 != 0)) {
              if (((in_stack_ffffffffffffff48 < 'B') || ('B' < in_stack_ffffffffffffff48)) ||
                 (iVar2 = strcmp(&stack0xffffffffffffff48,"BZIP2_1"), iVar2 != 0)) {
                if (((in_stack_ffffffffffffff48 < 'P') || ('P' < in_stack_ffffffffffffff48)) ||
                   (iVar2 = strcmp(&stack0xffffffffffffff48,"PLIO_1"), iVar2 != 0)) {
                  if (((in_stack_ffffffffffffff48 < 'N') || ('N' < in_stack_ffffffffffffff48)) ||
                     (iVar2 = strcmp(&stack0xffffffffffffff48,"NOCOMPRESS"), iVar2 != 0)) {
                    ffpmsg((char *)0x2143c3);
                    ffpmsg((char *)0x2143cd);
                    *local_18 = 0x19e;
                    return 0x19e;
                  }
                  *(undefined4 *)(*(long *)(local_10 + 8) + 0x43c) = 0xffffffff;
                }
                else {
                  *(undefined4 *)(*(long *)(local_10 + 8) + 0x43c) = 0x1f;
                }
              }
              else {
                *(undefined4 *)(*(long *)(local_10 + 8) + 0x43c) = 0x33;
              }
            }
            else {
              *(undefined4 *)(*(long *)(local_10 + 8) + 0x43c) = 0x16;
            }
          }
          else {
            *(undefined4 *)(*(long *)(local_10 + 8) + 0x43c) = 0x15;
          }
        }
        else {
          *(undefined4 *)(*(long *)(local_10 + 8) + 0x43c) = 0x29;
        }
      }
      else {
        *(undefined4 *)(*(long *)(local_10 + 8) + 0x43c) = 0xb;
      }
      iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                    (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                    (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                    (int *)CONCAT44(iVar4,uVar3));
      if (iVar2 < 1) {
        uVar5 = 0;
        if (((*(int *)(*(long *)(local_10 + 8) + 0x48c) < 0) &&
            (iVar2 = ffgcno(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                            in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                            in_stack_ffffffffffffff60), iVar2 == 0xdb)) &&
           (iVar2 = ffgcno(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff60), iVar2 == 0xdb)) {
          *(undefined4 *)(*(long *)(local_10 + 8) + 0x470) = 0x461c3c00;
        }
        else {
          iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                        (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                        (void *)((ulong)in_stack_ffffffffffffff44 << 0x20),
                        (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                        (int *)CONCAT44(iVar4,uVar3));
          if (iVar2 < 1) {
            if (((in_stack_ffffffffffffff48 < 'N') || ('N' < in_stack_ffffffffffffff48)) ||
               (iVar2 = strcmp(&stack0xffffffffffffff48,"NONE"), iVar2 != 0)) {
              if (((in_stack_ffffffffffffff48 < 'S') || ('S' < in_stack_ffffffffffffff48)) ||
                 (iVar2 = strcmp(&stack0xffffffffffffff48,"SUBTRACTIVE_DITHER_1"), iVar2 != 0)) {
                if (((in_stack_ffffffffffffff48 < 'S') || ('S' < in_stack_ffffffffffffff48)) ||
                   (iVar2 = strcmp(&stack0xffffffffffffff48,"SUBTRACTIVE_DITHER_2"), iVar2 != 0)) {
                  if (((in_stack_ffffffffffffff48 < 'N') || ('N' < in_stack_ffffffffffffff48)) ||
                     (iVar2 = strcmp(&stack0xffffffffffffff48,"NO_DITHER"), iVar2 != 0)) {
                    *(undefined4 *)(*(long *)(local_10 + 8) + 0x474) = 0;
                  }
                  else {
                    *(undefined4 *)(*(long *)(local_10 + 8) + 0x474) = 0xffffffff;
                  }
                }
                else {
                  *(undefined4 *)(*(long *)(local_10 + 8) + 0x474) = 2;
                }
              }
              else {
                *(undefined4 *)(*(long *)(local_10 + 8) + 0x474) = 1;
              }
            }
            else {
              *(undefined4 *)(*(long *)(local_10 + 8) + 0x470) = 0x461c3c00;
            }
          }
          else {
            *(undefined4 *)(*(long *)(local_10 + 8) + 0x474) = 0;
            *(undefined4 *)(*(long *)(local_10 + 8) + 0x470) = 0;
          }
        }
        uVar6 = 0;
        iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                      (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                      (void *)((ulong)in_stack_ffffffffffffff44 << 0x20),
                      (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),(int *)CONCAT44(iVar4,uVar3)
                     );
        if (iVar2 < 1) {
          *(undefined4 *)(*(long *)(local_10 + 8) + 0x478) = in_stack_ffffffffffffff38;
        }
        else {
          *(undefined4 *)(*(long *)(local_10 + 8) + 0x478) = 1;
        }
        iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                      (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                      (void *)CONCAT44(in_stack_ffffffffffffff44,uVar6),
                      (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),(int *)CONCAT44(iVar4,uVar3)
                     );
        if (iVar2 < 1) {
          if (*(int *)(*(long *)(local_10 + 8) + 0x490) < 1) {
            ffpmsg((char *)0x2147da);
            *local_18 = 0xd4;
            local_4 = 0xd4;
          }
          else if (*(int *)(*(long *)(local_10 + 8) + 0x490) < 7) {
            local_d8 = 1;
            local_e0 = 1;
            for (uVar7 = 0; (int)uVar7 < *(int *)(*(long *)(local_10 + 8) + 0x490);
                uVar7 = uVar7 + 1) {
              snprintf(local_68,0x4b,"ZNAXIS%d",(ulong)(uVar7 + 1));
              ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                    (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                    (void *)CONCAT44(uVar7,uVar6),(char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                    (int *)CONCAT44(iVar4,uVar3));
              if (0 < *local_18) {
                ffpmsg((char *)0x2148ee);
                return *local_18;
              }
              snprintf(local_68,0x4b,"ZTILE%d",(ulong)(uVar7 + 1));
              if (uVar7 == 0) {
                *(undefined8 *)(*(long *)(local_10 + 8) + 0x440) =
                     *(undefined8 *)(*(long *)(local_10 + 8) + 0x498);
              }
              else {
                *(undefined8 *)(*(long *)(local_10 + 8) + 0x440 + (long)(int)uVar7 * 8) = 1;
              }
              uVar6 = 0;
              ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                    (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                    (void *)((ulong)uVar7 << 0x20),(char *)CONCAT44(uVar5,in_stack_ffffffffffffff38)
                    ,(int *)CONCAT44(iVar4,uVar3));
              if (*(long *)(*(long *)(local_10 + 8) + 0x440 + (long)(int)uVar7 * 8) == 0) {
                ffpmsg((char *)0x2149e5);
                *local_18 = 0x19e;
                return 0x19e;
              }
              local_d8 = ((*(long *)(*(long *)(local_10 + 8) + 0x498 + (long)(int)uVar7 * 8) + -1) /
                          *(long *)(*(long *)(local_10 + 8) + 0x440 + (long)(int)uVar7 * 8) + 1) *
                         local_d8;
              local_e0 = *(long *)(*(long *)(local_10 + 8) + 0x440 + (long)(int)uVar7 * 8) *
                         local_e0;
            }
            if (local_d8 == *(long *)(*(long *)(local_10 + 8) + 0x3c0)) {
              if (*(int *)(*(long *)(local_10 + 8) + 0x43c) == 0xb) {
                iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                              (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                              (void *)CONCAT44(uVar7,uVar6),
                              (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                              (int *)CONCAT44(iVar4,uVar3));
                if (0 < iVar2) {
                  ffpmsg((char *)0x214b25);
                  return *local_18;
                }
                iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                              (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                              (void *)((ulong)uVar7 << 0x20),
                              (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                              (int *)CONCAT44(iVar4,uVar3));
                if (((iVar2 == 0) && ('M' < in_stack_ffffffffffffff48)) &&
                   ((in_stack_ffffffffffffff48 < 'O' &&
                    (iVar2 = strcmp(&stack0xffffffffffffff48,"NOISEBIT"), iVar2 == 0)))) {
                  iVar4 = 1;
                }
                if ((iVar4 != 0) ||
                   (iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                  (char *)CONCAT71(in_stack_ffffffffffffff49,
                                                   in_stack_ffffffffffffff48),
                                  (void *)((ulong)uVar7 << 0x20),
                                  (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                                  (int *)(ulong)uVar3), 0 < iVar2)) {
                  *(undefined4 *)(*(long *)(local_10 + 8) + 0x520) = 4;
                }
                if ((*(int *)(*(long *)(local_10 + 8) + 0x51c) < 0x10) &&
                   (8 < *(int *)(*(long *)(local_10 + 8) + 0x520))) {
                  uVar6 = *(undefined4 *)(*(long *)(local_10 + 8) + 0x520);
                  *(undefined4 *)(*(long *)(local_10 + 8) + 0x520) =
                       *(undefined4 *)(*(long *)(local_10 + 8) + 0x51c);
                  *(undefined4 *)(*(long *)(local_10 + 8) + 0x51c) = uVar6;
                }
              }
              else if (*(int *)(*(long *)(local_10 + 8) + 0x43c) == 0x29) {
                iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                              (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                              (void *)CONCAT44(uVar7,uVar6),
                              (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                              (int *)CONCAT44(iVar4,uVar3));
                if (0 < iVar2) {
                  ffpmsg((char *)0x214d00);
                  return *local_18;
                }
                ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                      (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                      (void *)((ulong)uVar7 << 0x20),
                      (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),(int *)CONCAT44(iVar4,uVar3)
                     );
              }
              *(long *)(*(long *)(local_10 + 8) + 0x4c8) = local_e0;
              if ((*(int *)(*(long *)(local_10 + 8) + 0x43c) == 0xb) &&
                 (*(int *)(*(long *)(local_10 + 8) + 0x51c) == 0)) {
                ffpmsg((char *)0x214da4);
                *local_18 = 0x19e;
                local_4 = 0x19e;
              }
              else {
                iVar2 = imcomp_calc_max_elem
                                  (*(int *)(*(long *)(local_10 + 8) + 0x43c),(int)local_e0,
                                   *(int *)(*(long *)(local_10 + 8) + 0x48c),
                                   *(int *)(*(long *)(local_10 + 8) + 0x51c));
                *(long *)(*(long *)(local_10 + 8) + 0x4d0) = (long)iVar2;
                iVar2 = ffgcno(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                               in_stack_ffffffffffffff60);
                if (iVar2 < 1) {
                  ffpmrk();
                  ffgcno(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60);
                  ffgcno(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60);
                  iVar2 = ffgcno(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                 in_stack_ffffffffffffff60);
                  if ((0 < iVar2) &&
                     (iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                    (char *)CONCAT71(in_stack_ffffffffffffff49,
                                                     in_stack_ffffffffffffff48),
                                    (void *)((ulong)uVar7 << 0x20),
                                    (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                                    (int *)CONCAT44(iVar4,uVar3)), iVar2 < 1)) {
                    *(undefined4 *)(*(long *)(local_10 + 8) + 0x4e4) = 0xffffffff;
                  }
                  iVar2 = ffgcno(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                 in_stack_ffffffffffffff60);
                  if ((0 < iVar2) &&
                     (iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                    (char *)CONCAT71(in_stack_ffffffffffffff49,
                                                     in_stack_ffffffffffffff48),
                                    (void *)((ulong)uVar7 << 0x20),
                                    (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                                    (int *)CONCAT44(iVar4,uVar3)), iVar2 < 1)) {
                    *(undefined4 *)(*(long *)(local_10 + 8) + 0x4e8) = 0xffffffff;
                  }
                  iVar2 = ffgcno(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                 in_stack_ffffffffffffff60);
                  if (0 < iVar2) {
                    iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                  (char *)CONCAT71(in_stack_ffffffffffffff49,
                                                   in_stack_ffffffffffffff48),
                                  (void *)((ulong)uVar7 << 0x20),
                                  (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                                  (int *)CONCAT44(iVar4,uVar3));
                    if (iVar2 < 1) {
                      *(undefined4 *)(*(long *)(local_10 + 8) + 0x4ec) = 0xffffffff;
                    }
                    else {
                      iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                    (char *)CONCAT71(in_stack_ffffffffffffff49,
                                                     in_stack_ffffffffffffff48),
                                    (void *)((ulong)uVar7 << 0x20),
                                    (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                                    (int *)CONCAT44(iVar4,uVar3));
                      if (iVar2 < 1) {
                        *(undefined4 *)(*(long *)(local_10 + 8) + 0x4ec) = 0xffffffff;
                      }
                    }
                  }
                  iVar2 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48
                                                ),(void *)((ulong)uVar7 << 0x20),
                                (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                                (int *)CONCAT44(iVar4,uVar3));
                  if (0 < iVar2) {
                    *(undefined8 *)(*(long *)(local_10 + 8) + 0x500) = 0x3ff0000000000000;
                  }
                  iVar4 = ffgky(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                (char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48
                                                ),(void *)((ulong)uVar7 << 0x20),
                                (char *)CONCAT44(uVar5,in_stack_ffffffffffffff38),
                                (int *)CONCAT44(iVar4,uVar3));
                  if (iVar4 < 1) {
                    *(undefined8 *)(*(long *)(local_10 + 8) + 0x510) =
                         *(undefined8 *)(*(long *)(local_10 + 8) + 0x508);
                  }
                  else {
                    *(undefined8 *)(*(long *)(local_10 + 8) + 0x508) = 0;
                    *(undefined8 *)(*(long *)(local_10 + 8) + 0x510) = 0;
                  }
                  fVar1 = *(float *)(*(long *)(local_10 + 8) + 0x420);
                  if ((fVar1 != 0.0) || (NAN(fVar1))) {
                    *(undefined4 *)(*(long *)(local_10 + 8) + 0x470) =
                         *(undefined4 *)(*(long *)(local_10 + 8) + 0x420);
                  }
                  ffcmrk();
                  local_4 = *local_18;
                }
                else {
                  ffpmsg((char *)0x214e5c);
                  *local_18 = 0x19e;
                  local_4 = 0x19e;
                }
              }
            }
            else {
              ffpmsg((char *)0x214aa4);
              *local_18 = 0x19e;
              local_4 = 0x19e;
            }
          }
          else {
            ffpmsg((char *)0x214819);
            *local_18 = 0xd4;
            local_4 = 0xd4;
          }
        }
        else {
          ffpmsg((char *)0x2147a3);
          local_4 = *local_18;
        }
      }
      else {
        ffpmsg((char *)0x214441);
        local_4 = *local_18;
      }
    }
    else {
      ffpmsg((char *)0x214076);
      ffpmsg((char *)0x214082);
      local_4 = *local_18;
    }
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int imcomp_get_compressed_image_par(fitsfile *infptr, int *status)
 
/* 
    This routine reads keywords from a BINTABLE extension containing a
    compressed image.
*/
{
    char keyword[FLEN_KEYWORD];
    char value[FLEN_VALUE];
    int ii, tstatus, tstatus2, doffset, oldFormat=0, colNum=0;
    long expect_nrows, maxtilelen;

    if (*status > 0)
        return(*status);

    /* Copy relevant header keyword values to structure */
    if (ffgky (infptr, TSTRING, "ZCMPTYPE", value, NULL, status) > 0)
    {
        ffpmsg("required ZCMPTYPE compression keyword not found in");
        ffpmsg(" imcomp_get_compressed_image_par");
        return(*status);
    }

    (infptr->Fptr)->zcmptype[0] = '\0';
    strncat((infptr->Fptr)->zcmptype, value, 11);

    if (!FSTRCMP(value, "RICE_1") || !FSTRCMP(value, "RICE_ONE") )
        (infptr->Fptr)->compress_type = RICE_1;
    else if (!FSTRCMP(value, "HCOMPRESS_1") )
        (infptr->Fptr)->compress_type = HCOMPRESS_1;
    else if (!FSTRCMP(value, "GZIP_1") )
        (infptr->Fptr)->compress_type = GZIP_1;
    else if (!FSTRCMP(value, "GZIP_2") )
        (infptr->Fptr)->compress_type = GZIP_2;
    else if (!FSTRCMP(value, "BZIP2_1") )
        (infptr->Fptr)->compress_type = BZIP2_1;
    else if (!FSTRCMP(value, "PLIO_1") )
        (infptr->Fptr)->compress_type = PLIO_1;
    else if (!FSTRCMP(value, "NOCOMPRESS") )
        (infptr->Fptr)->compress_type = NOCOMPRESS;
    else
    {
        ffpmsg("Unknown image compression type:");
        ffpmsg(value);
	return (*status = DATA_DECOMPRESSION_ERR);
    }
    
    if (ffgky (infptr, TINT,  "ZBITPIX",  &(infptr->Fptr)->zbitpix,  
               NULL, status) > 0)
    {
        ffpmsg("required ZBITPIX compression keyword not found");
        return(*status);
    }

    /* If ZZERO and ZSCALE columns don't exist for floating-point types,
     assume there is NO quantization.  Treat exactly as if it had ZQUANTIZ='NONE'.
     This is true regardless of whether or not file has a ZQUANTIZ keyword. */
    tstatus=0;
    tstatus2=0;
    if ((infptr->Fptr->zbitpix < 0) &&
       (fits_get_colnum(infptr,CASEINSEN,"ZZERO",&colNum,&tstatus)
	      == COL_NOT_FOUND) &&
       (fits_get_colnum(infptr,CASEINSEN,"ZSCALE",&colNum,&tstatus2)
	      == COL_NOT_FOUND)) {
	  (infptr->Fptr)->quantize_level = NO_QUANTIZE;
    }
    else {
       /* get the floating point to integer quantization type, if present. */
       /* FITS files produced before 2009 will not have this keyword */
       tstatus = 0;
       if (ffgky(infptr, TSTRING, "ZQUANTIZ", value, NULL, &tstatus) > 0)
       {
           (infptr->Fptr)->quantize_method = 0;
           (infptr->Fptr)->quantize_level = 0;
       } else {

           if (!FSTRCMP(value, "NONE") ) {
               (infptr->Fptr)->quantize_level = NO_QUANTIZE;
	  } else if (!FSTRCMP(value, "SUBTRACTIVE_DITHER_1") )
               (infptr->Fptr)->quantize_method = SUBTRACTIVE_DITHER_1;
           else if (!FSTRCMP(value, "SUBTRACTIVE_DITHER_2") )
               (infptr->Fptr)->quantize_method = SUBTRACTIVE_DITHER_2;
           else if (!FSTRCMP(value, "NO_DITHER") )
               (infptr->Fptr)->quantize_method = NO_DITHER;
           else
               (infptr->Fptr)->quantize_method = 0;
       }
    }

    /* get the floating point quantization dithering offset, if present. */
    /* FITS files produced before October 2009 will not have this keyword */
    tstatus = 0;
    if (ffgky(infptr, TINT, "ZDITHER0", &doffset, NULL, &tstatus) > 0)
    {
	/* by default start with 1st element of random sequence */
        (infptr->Fptr)->dither_seed = 1;  
    } else {
        (infptr->Fptr)->dither_seed = doffset;
    }

    if (ffgky (infptr,TINT, "ZNAXIS", &(infptr->Fptr)->zndim, NULL, status) > 0)
    {
        ffpmsg("required ZNAXIS compression keyword not found");
        return(*status);
    }

    if ((infptr->Fptr)->zndim < 1)
    {
        ffpmsg("Compressed image has no data (ZNAXIS < 1)");
	return (*status = BAD_NAXIS);
    }

    if ((infptr->Fptr)->zndim > MAX_COMPRESS_DIM)
    {
        ffpmsg("Compressed image has too many dimensions");
        return(*status = BAD_NAXIS);
    }

    expect_nrows = 1;
    maxtilelen = 1;
    for (ii = 0;  ii < (infptr->Fptr)->zndim;  ii++)
    {
        /* get image size */
        snprintf (keyword, FLEN_KEYWORD,"ZNAXIS%d", ii+1);
	ffgky (infptr, TLONG,keyword, &(infptr->Fptr)->znaxis[ii],NULL,status);

        if (*status > 0)
        {
            ffpmsg("required ZNAXISn compression keyword not found");
            return(*status);
        }

        /* get compression tile size */
	snprintf (keyword, FLEN_KEYWORD,"ZTILE%d", ii+1);

        /* set default tile size in case keywords are not present */
        if (ii == 0)
            (infptr->Fptr)->tilesize[0] = (infptr->Fptr)->znaxis[0];
        else
            (infptr->Fptr)->tilesize[ii] = 1;

        tstatus = 0;
	ffgky (infptr, TLONG, keyword, &(infptr->Fptr)->tilesize[ii], NULL, 
               &tstatus);
        if ((infptr->Fptr)->tilesize[ii] == 0)
        {
           ffpmsg("invalid ZTILE value = 0 in compressed image");
           return (*status = DATA_DECOMPRESSION_ERR);
        }
        expect_nrows *= (((infptr->Fptr)->znaxis[ii] - 1) / 
                  (infptr->Fptr)->tilesize[ii]+ 1);
        maxtilelen *= (infptr->Fptr)->tilesize[ii];
    }

    /* check number of rows */
    if (expect_nrows != (infptr->Fptr)->numrows)
    {
        ffpmsg(
        "number of table rows != the number of tiles in compressed image");
        return (*status = DATA_DECOMPRESSION_ERR);
    }

    /* read any algorithm specific parameters */
    if ((infptr->Fptr)->compress_type == RICE_1 )
    {
        if (ffgky(infptr, TINT,"ZVAL1", &(infptr->Fptr)->rice_blocksize,
                  NULL, status) > 0)
        {
            ffpmsg("required ZVAL1 compression keyword not found");
            return(*status);
        }

        tstatus = 0;
        /* First check for very old files, where ZVAL2 wasn't yet designated
           for bytepix */
        if (!ffgky(infptr, TSTRING, "ZNAME2", value, NULL, &tstatus)
                && !FSTRCMP(value, "NOISEBIT"))
        {
            oldFormat = 1;
        }
                
        tstatus = 0;
        if (oldFormat || ffgky(infptr, TINT,"ZVAL2", &(infptr->Fptr)->rice_bytepix,
                  NULL, &tstatus) > 0)
        {
            (infptr->Fptr)->rice_bytepix = 4;  /* default value */
        }

        if ((infptr->Fptr)->rice_blocksize < 16 &&
	    (infptr->Fptr)->rice_bytepix > 8) {
	     /* values are reversed */
	     tstatus = (infptr->Fptr)->rice_bytepix;
	     (infptr->Fptr)->rice_bytepix = (infptr->Fptr)->rice_blocksize;
	     (infptr->Fptr)->rice_blocksize = tstatus;
        }
    } else if ((infptr->Fptr)->compress_type == HCOMPRESS_1 ) {

        if (ffgky(infptr, TFLOAT,"ZVAL1", &(infptr->Fptr)->hcomp_scale,
                  NULL, status) > 0)
        {
            ffpmsg("required ZVAL1 compression keyword not found");
            return(*status);
        }

        tstatus = 0;
        ffgky(infptr, TINT,"ZVAL2", &(infptr->Fptr)->hcomp_smooth,
                  NULL, &tstatus);
    }    

    /* store number of pixels in each compression tile, */
    /* and max size of the compressed tile buffer */
    (infptr->Fptr)->maxtilelen = maxtilelen;

    /* prevent possible divide by zero in imcomp_calc_max_elem */
    if ((infptr->Fptr)->compress_type == RICE_1 && 
        (infptr->Fptr)->rice_blocksize == 0)
    {
        ffpmsg("Invalid RICE_1 blocksize = 0  (fits_get_compressed_img_par)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }
    (infptr->Fptr)->maxelem = 
           imcomp_calc_max_elem ((infptr->Fptr)->compress_type, maxtilelen, 
               (infptr->Fptr)->zbitpix, (infptr->Fptr)->rice_blocksize);

    /* Get Column numbers. */
    if (ffgcno(infptr, CASEINSEN, "COMPRESSED_DATA",
         &(infptr->Fptr)->cn_compressed, status) > 0)
    {
        ffpmsg("couldn't find COMPRESSED_DATA column (fits_get_compressed_img_par)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    ffpmrk(); /* put mark on message stack; erase any messages after this */

    tstatus = 0;
    ffgcno(infptr,CASEINSEN, "UNCOMPRESSED_DATA",
          &(infptr->Fptr)->cn_uncompressed, &tstatus);

    tstatus = 0;
    ffgcno(infptr,CASEINSEN, "GZIP_COMPRESSED_DATA",
          &(infptr->Fptr)->cn_gzip_data, &tstatus);

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZSCALE", &(infptr->Fptr)->cn_zscale,
              &tstatus) > 0)
    {
        /* CMPSCALE column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TDOUBLE, "ZSCALE", &(infptr->Fptr)->zscale, NULL, 
                 &tstatus) <= 0)
            (infptr->Fptr)->cn_zscale = -1;  /* flag for a constant ZSCALE */
    }

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZZERO", &(infptr->Fptr)->cn_zzero,
               &tstatus) > 0)
    {
        /* CMPZERO column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TDOUBLE, "ZZERO", &(infptr->Fptr)->zzero, NULL, 
                  &tstatus) <= 0)
            (infptr->Fptr)->cn_zzero = -1;  /* flag for a constant ZZERO */
    }

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZBLANK", &(infptr->Fptr)->cn_zblank,
               &tstatus) > 0)
    {
        /* ZBLANK column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TINT, "ZBLANK", &(infptr->Fptr)->zblank, NULL,
                  &tstatus) <= 0)  {
            (infptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */

        } else {
           /* ZBLANK keyword doesn't exist; see if there is a BLANK keyword */
           tstatus = 0;
           if (ffgky(infptr, TINT, "BLANK", &(infptr->Fptr)->zblank, NULL,
                  &tstatus) <= 0)  
              (infptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */
        }
    }

    /* read the conventional BSCALE and BZERO scaling keywords, if present */
    tstatus = 0;
    if (ffgky (infptr, TDOUBLE, "BSCALE", &(infptr->Fptr)->cn_bscale, 
        NULL, &tstatus) > 0)
    {
        (infptr->Fptr)->cn_bscale = 1.0;
    }

    tstatus = 0;
    if (ffgky (infptr, TDOUBLE, "BZERO", &(infptr->Fptr)->cn_bzero, 
        NULL, &tstatus) > 0)
    {
        (infptr->Fptr)->cn_bzero = 0.0;
        (infptr->Fptr)->cn_actual_bzero = 0.0;
    } else {
        (infptr->Fptr)->cn_actual_bzero = (infptr->Fptr)->cn_bzero;
    }

    /* special case: the quantization level is not given by a keyword in  */
    /* the HDU header, so we have to explicitly copy the requested value */
    /* to the actual value */
    if ( (infptr->Fptr)->request_quantize_level != 0.)
        (infptr->Fptr)->quantize_level = (infptr->Fptr)->request_quantize_level;

    ffcmrk();  /* clear any spurious error messages, back to the mark */
    return (*status);
}